

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *iEnd;
  BYTE *pBVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  ZSTD_matchState_t *pZVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  long *mEnd;
  BYTE *pBVar8;
  U32 *pUVar9;
  undefined8 uVar10;
  char cVar11;
  char cVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  size_t sVar16;
  byte bVar17;
  long *plVar18;
  long lVar19;
  long *plVar20;
  BYTE *pBVar21;
  long *plVar22;
  ulong uVar23;
  BYTE *iStart;
  ulong uVar24;
  int iVar25;
  U32 UVar26;
  BYTE *pBVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  long *plVar32;
  uint uVar33;
  uint uVar34;
  int *piVar35;
  long lVar36;
  seqDef *psVar37;
  uint uVar38;
  long *plVar40;
  long lVar41;
  ulong uVar42;
  int iVar43;
  long *plVar44;
  uint local_104;
  size_t local_100;
  BYTE *iend;
  ulong local_d0;
  ulong local_c8;
  U32 dictIndexDelta;
  U32 dictStartIndex;
  ulong uVar39;
  
  pZVar5 = ms->dictMatchState;
  if (pZVar5 == (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3e4d,
                  "size_t ZSTD_compressBlock_fast_dictMatchState(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar13 = (ms->cParams).minMatch;
  pUVar6 = ms->hashTable;
  uVar14 = (ms->cParams).targetLength;
  pBVar7 = (ms->window).base;
  uVar3 = (ms->window).dictLimit;
  iStart = pBVar7 + uVar3;
  iEnd = (long *)((long)src + srcSize);
  plVar18 = (long *)((long)src + (srcSize - 8));
  uVar4 = (pZVar5->window).dictLimit;
  mEnd = (long *)(pZVar5->window).nextSrc;
  pBVar8 = (pZVar5->window).base;
  pBVar27 = pBVar8 + uVar4;
  uVar30 = (int)mEnd - (int)pBVar8;
  uVar38 = uVar3 - uVar30;
  uVar39 = (ulong)uVar38;
  iVar28 = ((int)src - (int)iStart) + (int)mEnd;
  iVar25 = (int)pBVar27;
  uVar29 = iVar28 - iVar25;
  uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  pUVar9 = pZVar5->hashTable;
  iVar43 = (int)pBVar7;
  uVar34 = ((int)iEnd - iVar43) - uVar3;
  uVar15 = (ulong)(uVar14 + (uVar14 == 0));
  local_104 = *rep;
  uVar14 = rep[1];
  cVar11 = (char)(ms->cParams).hashLog;
  cVar12 = (char)(pZVar5->cParams).hashLog;
  plVar40 = (long *)src;
  if (uVar13 != 5) {
    if (uVar13 != 6) {
      if (uVar13 == 7) {
        if (uVar34 <= uVar33) {
          if (uVar3 < uVar30) {
LAB_001319a7:
            __assert_fail("prefixStartIndex >= (U32)(dictEnd - dictBase)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3ddd,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          if (uVar29 < local_104) {
LAB_001319c6:
            __assert_fail("offset_1 <= dictAndPrefixLength",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3de4,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          if (uVar29 < uVar14) {
LAB_001319e5:
            __assert_fail("offset_2 <= dictAndPrefixLength",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3de5,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          bVar17 = 0x40 - cVar11;
          plVar22 = iEnd + -4;
          plVar20 = (long *)((long)src + (ulong)(iVar28 == iVar25));
LAB_0012f546:
          if (plVar18 <= plVar20) {
LAB_00130fae:
            *rep = local_104;
            rep[1] = uVar14;
            return (long)iEnd - (long)plVar40;
          }
          lVar41 = *plVar20;
          uVar23 = (ulong)(lVar41 * -0x30e44323405a9d00) >> (bVar17 & 0x3f);
          uVar24 = (long)plVar20 - (long)pBVar7;
          uVar13 = pUVar6[uVar23];
          UVar26 = (U32)uVar24;
          uVar29 = (UVar26 - local_104) + 1;
          pUVar6[uVar23] = UVar26;
          if (2 < (uVar3 - 1) - uVar29) {
            piVar35 = (int *)(pBVar7 + uVar29);
            if (uVar29 < uVar3) {
              piVar35 = (int *)(pBVar8 + (uVar29 - uVar38));
            }
            if (*piVar35 != *(int *)((long)plVar20 + 1)) goto LAB_0012f5a8;
            plVar44 = iEnd;
            if (uVar29 < uVar3) {
              plVar44 = mEnd;
            }
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar20 + 5),(BYTE *)(piVar35 + 1),(BYTE *)iEnd,
                                (BYTE *)plVar44,iStart);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001318ce:
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
LAB_001318ed:
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            plVar44 = (long *)((long)plVar20 + 1);
            uVar42 = (long)plVar44 - (long)plVar40;
            plVar20 = (long *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar20 + uVar42)) {
LAB_0013190c:
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (iEnd < plVar44) {
LAB_0013192b:
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (plVar22 < plVar44) {
              ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar40,(BYTE *)plVar44,(BYTE *)plVar22)
              ;
LAB_0012f70a:
              seqStore->lit = seqStore->lit + uVar42;
              if (0xffff < uVar42) {
                if (seqStore->longLengthID != 0) {
LAB_00131a23:
                  __assert_fail("seqStorePtr->longLengthID == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x204d,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
            }
            else {
              lVar41 = plVar40[1];
              *plVar20 = *plVar40;
              plVar20[1] = lVar41;
              pBVar21 = seqStore->lit;
              if (0x10 < uVar42) {
                lVar41 = (long)(pBVar21 + 0x10) - (long)(plVar40 + 2);
                if (lVar41 < 8) {
                  if (-0x10 < lVar41) {
LAB_00131a42:
                    __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x1268,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                }
                else if (0xffffffffffffffe0 < lVar41 - 0x10U) {
LAB_00131a61:
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1270,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                lVar41 = plVar40[3];
                *(long *)(pBVar21 + 0x10) = plVar40[2];
                *(long *)(pBVar21 + 0x18) = lVar41;
                if (0x20 < (long)uVar42) {
                  lVar41 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)plVar40 + lVar41 + 0x20);
                    uVar10 = puVar2[1];
                    pBVar1 = pBVar21 + lVar41 + 0x20;
                    *(undefined8 *)pBVar1 = *puVar2;
                    *(undefined8 *)(pBVar1 + 8) = uVar10;
                    puVar2 = (undefined8 *)((long)plVar40 + lVar41 + 0x30);
                    uVar10 = puVar2[1];
                    *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                    *(undefined8 *)(pBVar1 + 0x18) = uVar10;
                    lVar41 = lVar41 + 0x20;
                  } while (pBVar1 + 0x20 < pBVar21 + uVar42);
                }
                goto LAB_0012f70a;
              }
              seqStore->lit = pBVar21 + uVar42;
            }
            lVar19 = sVar16 + 4;
            uVar23 = sVar16 + 1;
            psVar37 = seqStore->sequences;
            psVar37->litLength = (U16)uVar42;
            psVar37->offset = 1;
            uVar13 = local_104;
            if (0xffff < uVar23) {
              if (seqStore->longLengthID != 0) {
LAB_0013194a:
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
LAB_0012fa73:
              local_104 = uVar13;
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar37 - (long)seqStore->sequencesStart) >> 3);
              uVar13 = local_104;
            }
LAB_0012fa9a:
            local_104 = uVar13;
            plVar40 = (long *)(lVar19 + (long)plVar44);
            psVar37->matchLength = (U16)uVar23;
            psVar37 = psVar37 + 1;
            seqStore->sequences = psVar37;
            plVar20 = plVar40;
            if (plVar40 <= plVar18) {
              if (pBVar7 + (uVar24 & 0xffffffff) + 2 <= src) {
LAB_00131a04:
                __assert_fail("base+current+2 > istart",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x3e25,
                              "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                             );
              }
              pUVar6[(ulong)(*(long *)(pBVar7 + (uVar24 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                     (bVar17 & 0x3f)] = UVar26 + 2;
              pUVar6[(ulong)(*(long *)((long)plVar40 + -2) * -0x30e44323405a9d00) >> (bVar17 & 0x3f)
                    ] = ((int)plVar40 + -2) - iVar43;
              uVar13 = uVar14;
              for (; uVar14 = uVar13, plVar20 = plVar40, plVar40 <= plVar18;
                  plVar40 = (long *)((long)plVar40 + sVar16 + 4)) {
                UVar26 = (int)plVar40 - iVar43;
                uVar13 = UVar26 - uVar14;
                pBVar21 = pBVar7;
                if (uVar13 < uVar3) {
                  pBVar21 = pBVar8 + -uVar39;
                }
                if (((uVar3 - 1) - uVar13 < 3) || (*(int *)(pBVar21 + uVar13) != (int)*plVar40))
                break;
                plVar20 = iEnd;
                if (uVar13 < uVar3) {
                  plVar20 = mEnd;
                }
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)plVar40 + 4),
                                    (BYTE *)((long)(pBVar21 + uVar13) + 4),(BYTE *)iEnd,
                                    (BYTE *)plVar20,iStart);
                if (seqStore->maxNbSeq <=
                    (ulong)((long)psVar37 - (long)seqStore->sequencesStart >> 3)) goto LAB_001318ce;
                if (0x20000 < seqStore->maxNbLit) goto LAB_001318ed;
                plVar20 = (long *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < plVar20) goto LAB_0013190c;
                if (iEnd < plVar40) goto LAB_0013192b;
                if (plVar22 < plVar40) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)plVar20,(BYTE *)plVar40,(BYTE *)plVar40,(BYTE *)plVar22);
                }
                else {
                  lVar41 = plVar40[1];
                  *plVar20 = *plVar40;
                  plVar20[1] = lVar41;
                }
                psVar37 = seqStore->sequences;
                psVar37->litLength = 0;
                psVar37->offset = 1;
                if (0xffff < sVar16 + 1) {
                  if (seqStore->longLengthID != 0) goto LAB_0013194a;
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar37 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar37->matchLength = (U16)(sVar16 + 1);
                psVar37 = psVar37 + 1;
                seqStore->sequences = psVar37;
                pUVar6[(ulong)(*plVar40 * -0x30e44323405a9d00) >> (bVar17 & 0x3f)] = UVar26;
                uVar13 = local_104;
                local_104 = uVar14;
              }
            }
            goto LAB_0012f546;
          }
LAB_0012f5a8:
          if (uVar3 < uVar13) {
            piVar35 = (int *)(pBVar7 + uVar13);
            if (*piVar35 == (int)*plVar20) {
              uVar13 = (int)plVar20 - (int)piVar35;
              local_100 = ZSTD_count((BYTE *)((long)plVar20 + 4),(BYTE *)(piVar35 + 1),(BYTE *)iEnd)
              ;
              for (lVar41 = 0;
                  ((plVar44 = (long *)((long)plVar20 + lVar41),
                   iStart < (BYTE *)((long)piVar35 + lVar41) && (plVar40 < plVar44)) &&
                  (*(BYTE *)((long)plVar20 + lVar41 + -1) == *(BYTE *)((long)piVar35 + lVar41 + -1))
                  ); lVar41 = lVar41 + -1) {
              }
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_001318ce;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001318ed;
              plVar32 = (long *)seqStore->lit;
              lVar36 = (long)plVar20 - (long)plVar40;
              lVar19 = lVar36 + lVar41;
              if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + lVar19))
              goto LAB_0013190c;
              if (iEnd < plVar44) goto LAB_0013192b;
              local_d0 = (long)plVar44 - (long)plVar40;
              if (plVar22 < plVar44) {
LAB_0012f923:
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar32,(BYTE *)plVar40,(BYTE *)plVar44,(BYTE *)plVar22);
                goto LAB_0012f947;
              }
              lVar31 = plVar40[1];
              *plVar32 = *plVar40;
              plVar32[1] = lVar31;
              pBVar21 = seqStore->lit;
              if (0x10 < local_d0) {
                lVar31 = (long)(pBVar21 + 0x10) - (long)(plVar40 + 2);
                if (lVar31 < 8) {
                  if (-0x10 < lVar31) goto LAB_00131a42;
                }
                else if (0xffffffffffffffe0 < lVar31 - 0x10U) goto LAB_00131a61;
                lVar31 = plVar40[3];
                *(long *)(pBVar21 + 0x10) = plVar40[2];
                *(long *)(pBVar21 + 0x18) = lVar31;
                if (0x20 < (long)local_d0) {
                  lVar31 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x20);
                    uVar10 = puVar2[1];
                    pBVar1 = pBVar21 + lVar31 + 0x20;
                    *(undefined8 *)pBVar1 = *puVar2;
                    *(undefined8 *)(pBVar1 + 8) = uVar10;
                    puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x30);
                    uVar10 = puVar2[1];
                    *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                    *(undefined8 *)(pBVar1 + 0x18) = uVar10;
                    lVar31 = lVar31 + 0x20;
                  } while (pBVar1 + 0x20 < pBVar21 + lVar19);
                }
                goto LAB_0012f947;
              }
LAB_0012fa1d:
              seqStore->lit = pBVar21 + lVar19;
LAB_0012fa29:
              uVar23 = (local_100 - lVar41) + 1;
              lVar19 = (local_100 - lVar41) + 4;
              psVar37 = seqStore->sequences;
              psVar37->litLength = (short)lVar41 + ((short)plVar20 - (short)plVar40);
              psVar37->offset = uVar13 + 3;
              uVar14 = local_104;
              if (uVar23 < 0x10000) goto LAB_0012fa9a;
              if (seqStore->longLengthID == 0) goto LAB_0012fa73;
              goto LAB_0013194a;
            }
          }
          else {
            uVar13 = pUVar9[(ulong)(lVar41 * -0x30e44323405a9d00) >> (0x40U - cVar12 & 0x3f)];
            uVar23 = (ulong)uVar13;
            if ((uVar4 < uVar13) && (*(int *)(pBVar8 + uVar23) == (int)*plVar20)) {
              uVar13 = (UVar26 - uVar38) - uVar13;
              local_100 = ZSTD_count_2segments
                                    ((BYTE *)((long)plVar20 + 4),pBVar8 + uVar23 + 4,(BYTE *)iEnd,
                                     (BYTE *)mEnd,iStart);
              for (lVar41 = 0;
                  ((plVar44 = (long *)((long)plVar20 + lVar41), pBVar27 < pBVar8 + lVar41 + uVar23
                   && (plVar40 < plVar44)) &&
                  (*(BYTE *)((long)plVar20 + lVar41 + -1) == pBVar8[lVar41 + (uVar23 - 1)]));
                  lVar41 = lVar41 + -1) {
              }
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_001318ce;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001318ed;
              plVar32 = (long *)seqStore->lit;
              lVar36 = (long)plVar20 - (long)plVar40;
              lVar19 = lVar36 + lVar41;
              if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + lVar19))
              goto LAB_0013190c;
              if (iEnd < plVar44) goto LAB_0013192b;
              local_d0 = (long)plVar44 - (long)plVar40;
              if (plVar22 < plVar44) goto LAB_0012f923;
              lVar31 = plVar40[1];
              *plVar32 = *plVar40;
              plVar32[1] = lVar31;
              pBVar21 = seqStore->lit;
              if (local_d0 < 0x11) goto LAB_0012fa1d;
              lVar31 = (long)(pBVar21 + 0x10) - (long)(plVar40 + 2);
              if (lVar31 < 8) {
                if (-0x10 < lVar31) goto LAB_00131a42;
              }
              else if (0xffffffffffffffe0 < lVar31 - 0x10U) goto LAB_00131a61;
              lVar31 = plVar40[3];
              *(long *)(pBVar21 + 0x10) = plVar40[2];
              *(long *)(pBVar21 + 0x18) = lVar31;
              if (0x20 < (long)local_d0) {
                lVar31 = 0;
                do {
                  puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x20);
                  uVar10 = puVar2[1];
                  pBVar1 = pBVar21 + lVar31 + 0x20;
                  *(undefined8 *)pBVar1 = *puVar2;
                  *(undefined8 *)(pBVar1 + 8) = uVar10;
                  puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x30);
                  uVar10 = puVar2[1];
                  *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                  *(undefined8 *)(pBVar1 + 0x18) = uVar10;
                  lVar31 = lVar31 + 0x20;
                } while (pBVar1 + 0x20 < pBVar21 + lVar19);
              }
LAB_0012f947:
              seqStore->lit = seqStore->lit + lVar41 + lVar36;
              if (local_d0 < 0x10000) goto LAB_0012fa29;
              if (seqStore->longLengthID != 0) goto LAB_00131a23;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
              goto LAB_0012fa29;
            }
          }
          plVar20 = (long *)((long)plVar20 + ((long)plVar20 - (long)plVar40 >> 8) + uVar15);
          goto LAB_0012f546;
        }
      }
      else if (uVar34 <= uVar33) {
        if (uVar3 < uVar30) goto LAB_001319a7;
        if (uVar29 < local_104) goto LAB_001319c6;
        if (uVar29 < uVar14) goto LAB_001319e5;
        bVar17 = 0x20 - cVar11;
        plVar20 = iEnd + -4;
        plVar22 = (long *)((long)src + (ulong)(iVar28 == iVar25));
LAB_00131076:
        if (plVar18 <= plVar22) goto LAB_00130fae;
        uVar30 = (uint)((int)*plVar22 * -0x61c8864f) >> (bVar17 & 0x1f);
        uVar23 = (long)plVar22 - (long)pBVar7;
        uVar13 = pUVar6[uVar30];
        UVar26 = (U32)uVar23;
        uVar29 = (UVar26 - local_104) + 1;
        pUVar6[uVar30] = UVar26;
        if (2 < (uVar3 - 1) - uVar29) {
          piVar35 = (int *)(pBVar7 + uVar29);
          if (uVar29 < uVar3) {
            piVar35 = (int *)(pBVar8 + (uVar29 - uVar38));
          }
          if (*piVar35 != *(int *)((long)plVar22 + 1)) goto LAB_001310d3;
          plVar44 = iEnd;
          if (uVar29 < uVar3) {
            plVar44 = mEnd;
          }
          sVar16 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar22 + 5),(BYTE *)(piVar35 + 1),(BYTE *)iEnd,
                              (BYTE *)plVar44,iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001318ce;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001318ed;
          plVar44 = (long *)((long)plVar22 + 1);
          uVar42 = (long)plVar44 - (long)plVar40;
          plVar22 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar22 + uVar42))
          goto LAB_0013190c;
          if (iEnd < plVar44) goto LAB_0013192b;
          if (plVar20 < plVar44) {
            ZSTD_safecopyLiterals((BYTE *)plVar22,(BYTE *)plVar40,(BYTE *)plVar44,(BYTE *)plVar20);
LAB_00131230:
            seqStore->lit = seqStore->lit + uVar42;
            if (0xffff < uVar42) {
              if (seqStore->longLengthID != 0) goto LAB_00131a23;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar41 = plVar40[1];
            *plVar22 = *plVar40;
            plVar22[1] = lVar41;
            pBVar21 = seqStore->lit;
            if (0x10 < uVar42) {
              lVar41 = (long)(pBVar21 + 0x10) - (long)(plVar40 + 2);
              if (lVar41 < 8) {
                if (-0x10 < lVar41) goto LAB_00131a42;
              }
              else if (0xffffffffffffffe0 < lVar41 - 0x10U) goto LAB_00131a61;
              lVar41 = plVar40[3];
              *(long *)(pBVar21 + 0x10) = plVar40[2];
              *(long *)(pBVar21 + 0x18) = lVar41;
              if (0x20 < (long)uVar42) {
                lVar41 = 0;
                do {
                  puVar2 = (undefined8 *)((long)plVar40 + lVar41 + 0x20);
                  uVar10 = puVar2[1];
                  pBVar1 = pBVar21 + lVar41 + 0x20;
                  *(undefined8 *)pBVar1 = *puVar2;
                  *(undefined8 *)(pBVar1 + 8) = uVar10;
                  puVar2 = (undefined8 *)((long)plVar40 + lVar41 + 0x30);
                  uVar10 = puVar2[1];
                  *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                  *(undefined8 *)(pBVar1 + 0x18) = uVar10;
                  lVar41 = lVar41 + 0x20;
                } while (pBVar1 + 0x20 < pBVar21 + uVar42);
              }
              goto LAB_00131230;
            }
            seqStore->lit = pBVar21 + uVar42;
          }
          lVar19 = sVar16 + 4;
          uVar24 = sVar16 + 1;
          psVar37 = seqStore->sequences;
          psVar37->litLength = (U16)uVar42;
          psVar37->offset = 1;
          uVar13 = local_104;
          if (0xffff < uVar24) {
            if (seqStore->longLengthID != 0) goto LAB_0013194a;
LAB_001315af:
            local_104 = uVar13;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar37 - (long)seqStore->sequencesStart) >> 3);
            uVar13 = local_104;
          }
LAB_001315db:
          local_104 = uVar13;
          plVar40 = (long *)(lVar19 + (long)plVar44);
          psVar37->matchLength = (U16)uVar24;
          psVar37 = psVar37 + 1;
          seqStore->sequences = psVar37;
          plVar22 = plVar40;
          if (plVar40 <= plVar18) {
            if (pBVar7 + (uVar23 & 0xffffffff) + 2 <= src) goto LAB_00131a04;
            pUVar6[(uint)(*(int *)(pBVar7 + (uVar23 & 0xffffffff) + 2) * -0x61c8864f) >>
                   (bVar17 & 0x1f)] = UVar26 + 2;
            pUVar6[(uint)(*(int *)((long)plVar40 + -2) * -0x61c8864f) >> (bVar17 & 0x1f)] =
                 ((int)plVar40 + -2) - iVar43;
            uVar13 = uVar14;
            for (; uVar14 = uVar13, plVar22 = plVar40, plVar40 <= plVar18;
                plVar40 = (long *)((long)plVar40 + sVar16 + 4)) {
              UVar26 = (int)plVar40 - iVar43;
              uVar13 = UVar26 - uVar14;
              pBVar21 = pBVar7;
              if (uVar13 < uVar3) {
                pBVar21 = pBVar8 + -uVar39;
              }
              if (((uVar3 - 1) - uVar13 < 3) || (*(int *)(pBVar21 + uVar13) != (int)*plVar40))
              break;
              plVar22 = iEnd;
              if (uVar13 < uVar3) {
                plVar22 = mEnd;
              }
              sVar16 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar40 + 4),(BYTE *)((long)(pBVar21 + uVar13) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)plVar22,iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar37 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_001318ce;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001318ed;
              plVar22 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar22) goto LAB_0013190c;
              if (iEnd < plVar40) goto LAB_0013192b;
              if (plVar20 < plVar40) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar22,(BYTE *)plVar40,(BYTE *)plVar40,(BYTE *)plVar20);
              }
              else {
                lVar41 = plVar40[1];
                *plVar22 = *plVar40;
                plVar22[1] = lVar41;
              }
              psVar37 = seqStore->sequences;
              psVar37->litLength = 0;
              psVar37->offset = 1;
              if (0xffff < sVar16 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_0013194a;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar37 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar37->matchLength = (U16)(sVar16 + 1);
              psVar37 = psVar37 + 1;
              seqStore->sequences = psVar37;
              pUVar6[(uint)((int)*plVar40 * -0x61c8864f) >> (bVar17 & 0x1f)] = UVar26;
              uVar13 = local_104;
              local_104 = uVar14;
            }
          }
          goto LAB_00131076;
        }
LAB_001310d3:
        if (uVar3 < uVar13) {
          piVar35 = (int *)(pBVar7 + uVar13);
          if (*piVar35 == (int)*plVar22) {
            uVar13 = (int)plVar22 - (int)piVar35;
            local_100 = ZSTD_count((BYTE *)((long)plVar22 + 4),(BYTE *)(piVar35 + 1),(BYTE *)iEnd);
            for (lVar41 = 0;
                ((plVar44 = (long *)((long)plVar22 + lVar41),
                 iStart < (BYTE *)((long)piVar35 + lVar41) && (plVar40 < plVar44)) &&
                (*(BYTE *)((long)plVar22 + lVar41 + -1) == *(BYTE *)((long)piVar35 + lVar41 + -1)));
                lVar41 = lVar41 + -1) {
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_001318ce;
            if (0x20000 < seqStore->maxNbLit) goto LAB_001318ed;
            plVar32 = (long *)seqStore->lit;
            lVar36 = (long)plVar22 - (long)plVar40;
            lVar19 = lVar36 + lVar41;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + lVar19))
            goto LAB_0013190c;
            if (iEnd < plVar44) goto LAB_0013192b;
            local_c8 = (long)plVar44 - (long)plVar40;
            if (plVar20 < plVar44) {
LAB_00131452:
              ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)plVar40,(BYTE *)plVar44,(BYTE *)plVar20)
              ;
              goto LAB_0013147b;
            }
            lVar31 = plVar40[1];
            *plVar32 = *plVar40;
            plVar32[1] = lVar31;
            pBVar21 = seqStore->lit;
            if (0x10 < local_c8) {
              lVar31 = (long)(pBVar21 + 0x10) - (long)(plVar40 + 2);
              if (lVar31 < 8) {
                if (-0x10 < lVar31) goto LAB_00131a42;
              }
              else if (0xffffffffffffffe0 < lVar31 - 0x10U) goto LAB_00131a61;
              lVar31 = plVar40[3];
              *(long *)(pBVar21 + 0x10) = plVar40[2];
              *(long *)(pBVar21 + 0x18) = lVar31;
              if (0x20 < (long)local_c8) {
                lVar31 = 0;
                do {
                  puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x20);
                  uVar10 = puVar2[1];
                  pBVar1 = pBVar21 + lVar31 + 0x20;
                  *(undefined8 *)pBVar1 = *puVar2;
                  *(undefined8 *)(pBVar1 + 8) = uVar10;
                  puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x30);
                  uVar10 = puVar2[1];
                  *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                  *(undefined8 *)(pBVar1 + 0x18) = uVar10;
                  lVar31 = lVar31 + 0x20;
                } while (pBVar1 + 0x20 < pBVar21 + lVar19);
              }
              goto LAB_0013147b;
            }
LAB_00131556:
            seqStore->lit = pBVar21 + lVar19;
LAB_0013155d:
            uVar24 = (local_100 - lVar41) + 1;
            lVar19 = (local_100 - lVar41) + 4;
            psVar37 = seqStore->sequences;
            psVar37->litLength = (short)lVar41 + ((short)plVar22 - (short)plVar40);
            psVar37->offset = uVar13 + 3;
            uVar14 = local_104;
            if (uVar24 < 0x10000) goto LAB_001315db;
            if (seqStore->longLengthID == 0) goto LAB_001315af;
            goto LAB_0013194a;
          }
        }
        else {
          uVar13 = pUVar9[(uint)((int)*plVar22 * -0x61c8864f) >> (0x20U - cVar12 & 0x1f)];
          uVar24 = (ulong)uVar13;
          if ((uVar4 < uVar13) && (*(int *)(pBVar8 + uVar24) == (int)*plVar22)) {
            uVar13 = UVar26 - (uVar38 + uVar13);
            local_100 = ZSTD_count_2segments
                                  ((BYTE *)((long)plVar22 + 4),pBVar8 + uVar24 + 4,(BYTE *)iEnd,
                                   (BYTE *)mEnd,iStart);
            for (lVar41 = 0;
                ((plVar44 = (long *)((long)plVar22 + lVar41), pBVar27 < pBVar8 + lVar41 + uVar24 &&
                 (plVar40 < plVar44)) &&
                (*(BYTE *)((long)plVar22 + lVar41 + -1) == pBVar8[lVar41 + (uVar24 - 1)]));
                lVar41 = lVar41 + -1) {
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_001318ce;
            if (0x20000 < seqStore->maxNbLit) goto LAB_001318ed;
            plVar32 = (long *)seqStore->lit;
            lVar36 = (long)plVar22 - (long)plVar40;
            lVar19 = lVar36 + lVar41;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + lVar19))
            goto LAB_0013190c;
            if (iEnd < plVar44) goto LAB_0013192b;
            local_c8 = (long)plVar44 - (long)plVar40;
            if (plVar20 < plVar44) goto LAB_00131452;
            lVar31 = plVar40[1];
            *plVar32 = *plVar40;
            plVar32[1] = lVar31;
            pBVar21 = seqStore->lit;
            if (local_c8 < 0x11) goto LAB_00131556;
            lVar31 = (long)(pBVar21 + 0x10) - (long)(plVar40 + 2);
            if (lVar31 < 8) {
              if (-0x10 < lVar31) goto LAB_00131a42;
            }
            else if (0xffffffffffffffe0 < lVar31 - 0x10U) goto LAB_00131a61;
            lVar31 = plVar40[3];
            *(long *)(pBVar21 + 0x10) = plVar40[2];
            *(long *)(pBVar21 + 0x18) = lVar31;
            if (0x20 < (long)local_c8) {
              lVar31 = 0;
              do {
                puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x20);
                uVar10 = puVar2[1];
                pBVar1 = pBVar21 + lVar31 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar10;
                puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x30);
                uVar10 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar10;
                lVar31 = lVar31 + 0x20;
              } while (pBVar1 + 0x20 < pBVar21 + lVar19);
            }
LAB_0013147b:
            seqStore->lit = seqStore->lit + lVar41 + lVar36;
            if (local_c8 < 0x10000) goto LAB_0013155d;
            if (seqStore->longLengthID != 0) goto LAB_00131a23;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            goto LAB_0013155d;
          }
        }
        plVar22 = (long *)((long)plVar22 + ((long)plVar22 - (long)plVar40 >> 8) + uVar15);
        goto LAB_00131076;
      }
LAB_00131988:
      __assert_fail("endIndex - prefixStartIndex <= maxDistance",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3dd8,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (uVar33 < uVar34) goto LAB_00131988;
    if (uVar3 < uVar30) goto LAB_001319a7;
    if (uVar29 < local_104) goto LAB_001319c6;
    if (uVar29 < uVar14) goto LAB_001319e5;
    bVar17 = 0x40 - cVar11;
    plVar22 = iEnd + -4;
    plVar20 = (long *)((long)src + (ulong)(iVar28 == iVar25));
LAB_0012fe41:
    if (plVar18 <= plVar20) goto LAB_00130fae;
    lVar41 = *plVar20;
    uVar23 = (ulong)(lVar41 * -0x30e4432340650000) >> (bVar17 & 0x3f);
    uVar24 = (long)plVar20 - (long)pBVar7;
    uVar13 = pUVar6[uVar23];
    UVar26 = (U32)uVar24;
    uVar29 = (UVar26 - local_104) + 1;
    pUVar6[uVar23] = UVar26;
    if (2 < (uVar3 - 1) - uVar29) {
      piVar35 = (int *)(pBVar7 + uVar29);
      if (uVar29 < uVar3) {
        piVar35 = (int *)(pBVar8 + (uVar29 - uVar38));
      }
      if (*piVar35 != *(int *)((long)plVar20 + 1)) goto LAB_0012fea3;
      plVar44 = iEnd;
      if (uVar29 < uVar3) {
        plVar44 = mEnd;
      }
      sVar16 = ZSTD_count_2segments
                         ((BYTE *)((long)plVar20 + 5),(BYTE *)(piVar35 + 1),(BYTE *)iEnd,
                          (BYTE *)plVar44,iStart);
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_001318ce;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001318ed;
      plVar44 = (long *)((long)plVar20 + 1);
      uVar42 = (long)plVar44 - (long)plVar40;
      plVar20 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar20 + uVar42))
      goto LAB_0013190c;
      if (iEnd < plVar44) goto LAB_0013192b;
      if (plVar22 < plVar44) {
        ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar40,(BYTE *)plVar44,(BYTE *)plVar22);
LAB_00130005:
        seqStore->lit = seqStore->lit + uVar42;
        if (0xffff < uVar42) {
          if (seqStore->longLengthID != 0) goto LAB_00131a23;
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        lVar41 = plVar40[1];
        *plVar20 = *plVar40;
        plVar20[1] = lVar41;
        pBVar21 = seqStore->lit;
        if (0x10 < uVar42) {
          lVar41 = (long)(pBVar21 + 0x10) - (long)(plVar40 + 2);
          if (lVar41 < 8) {
            if (-0x10 < lVar41) goto LAB_00131a42;
          }
          else if (0xffffffffffffffe0 < lVar41 - 0x10U) goto LAB_00131a61;
          lVar41 = plVar40[3];
          *(long *)(pBVar21 + 0x10) = plVar40[2];
          *(long *)(pBVar21 + 0x18) = lVar41;
          if (0x20 < (long)uVar42) {
            lVar41 = 0;
            do {
              puVar2 = (undefined8 *)((long)plVar40 + lVar41 + 0x20);
              uVar10 = puVar2[1];
              pBVar1 = pBVar21 + lVar41 + 0x20;
              *(undefined8 *)pBVar1 = *puVar2;
              *(undefined8 *)(pBVar1 + 8) = uVar10;
              puVar2 = (undefined8 *)((long)plVar40 + lVar41 + 0x30);
              uVar10 = puVar2[1];
              *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
              *(undefined8 *)(pBVar1 + 0x18) = uVar10;
              lVar41 = lVar41 + 0x20;
            } while (pBVar1 + 0x20 < pBVar21 + uVar42);
          }
          goto LAB_00130005;
        }
        seqStore->lit = pBVar21 + uVar42;
      }
      lVar19 = sVar16 + 4;
      uVar23 = sVar16 + 1;
      psVar37 = seqStore->sequences;
      psVar37->litLength = (U16)uVar42;
      psVar37->offset = 1;
      uVar13 = local_104;
      if (0xffff < uVar23) {
        if (seqStore->longLengthID != 0) goto LAB_0013194a;
LAB_0013036e:
        local_104 = uVar13;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar37 - (long)seqStore->sequencesStart) >> 3);
        uVar13 = local_104;
      }
LAB_00130395:
      local_104 = uVar13;
      plVar40 = (long *)(lVar19 + (long)plVar44);
      psVar37->matchLength = (U16)uVar23;
      psVar37 = psVar37 + 1;
      seqStore->sequences = psVar37;
      plVar20 = plVar40;
      if (plVar40 <= plVar18) {
        if (pBVar7 + (uVar24 & 0xffffffff) + 2 <= src) goto LAB_00131a04;
        pUVar6[(ulong)(*(long *)(pBVar7 + (uVar24 & 0xffffffff) + 2) * -0x30e4432340650000) >>
               (bVar17 & 0x3f)] = UVar26 + 2;
        pUVar6[(ulong)(*(long *)((long)plVar40 + -2) * -0x30e4432340650000) >> (bVar17 & 0x3f)] =
             ((int)plVar40 + -2) - iVar43;
        uVar13 = uVar14;
        for (; uVar14 = uVar13, plVar20 = plVar40, plVar40 <= plVar18;
            plVar40 = (long *)((long)plVar40 + sVar16 + 4)) {
          UVar26 = (int)plVar40 - iVar43;
          uVar13 = UVar26 - uVar14;
          pBVar21 = pBVar7;
          if (uVar13 < uVar3) {
            pBVar21 = pBVar8 + -uVar39;
          }
          if (((uVar3 - 1) - uVar13 < 3) || (*(int *)(pBVar21 + uVar13) != (int)*plVar40)) break;
          plVar20 = iEnd;
          if (uVar13 < uVar3) {
            plVar20 = mEnd;
          }
          sVar16 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar40 + 4),(BYTE *)((long)(pBVar21 + uVar13) + 4),
                              (BYTE *)iEnd,(BYTE *)plVar20,iStart);
          if (seqStore->maxNbSeq <= (ulong)((long)psVar37 - (long)seqStore->sequencesStart >> 3))
          goto LAB_001318ce;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001318ed;
          plVar20 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < plVar20) goto LAB_0013190c;
          if (iEnd < plVar40) goto LAB_0013192b;
          if (plVar22 < plVar40) {
            ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar40,(BYTE *)plVar40,(BYTE *)plVar22);
          }
          else {
            lVar41 = plVar40[1];
            *plVar20 = *plVar40;
            plVar20[1] = lVar41;
          }
          psVar37 = seqStore->sequences;
          psVar37->litLength = 0;
          psVar37->offset = 1;
          if (0xffff < sVar16 + 1) {
            if (seqStore->longLengthID != 0) goto LAB_0013194a;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar37 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar37->matchLength = (U16)(sVar16 + 1);
          psVar37 = psVar37 + 1;
          seqStore->sequences = psVar37;
          pUVar6[(ulong)(*plVar40 * -0x30e4432340650000) >> (bVar17 & 0x3f)] = UVar26;
          uVar13 = local_104;
          local_104 = uVar14;
        }
      }
      goto LAB_0012fe41;
    }
LAB_0012fea3:
    if (uVar3 < uVar13) {
      piVar35 = (int *)(pBVar7 + uVar13);
      if (*piVar35 == (int)*plVar20) {
        uVar13 = (int)plVar20 - (int)piVar35;
        local_100 = ZSTD_count((BYTE *)((long)plVar20 + 4),(BYTE *)(piVar35 + 1),(BYTE *)iEnd);
        for (lVar41 = 0;
            ((plVar44 = (long *)((long)plVar20 + lVar41), iStart < (BYTE *)((long)piVar35 + lVar41)
             && (plVar40 < plVar44)) &&
            (*(BYTE *)((long)plVar20 + lVar41 + -1) == *(BYTE *)((long)piVar35 + lVar41 + -1)));
            lVar41 = lVar41 + -1) {
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001318ce;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001318ed;
        plVar32 = (long *)seqStore->lit;
        lVar36 = (long)plVar20 - (long)plVar40;
        lVar19 = lVar36 + lVar41;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + lVar19))
        goto LAB_0013190c;
        if (iEnd < plVar44) goto LAB_0013192b;
        local_d0 = (long)plVar44 - (long)plVar40;
        if (plVar22 < plVar44) {
LAB_0013021e:
          ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)plVar40,(BYTE *)plVar44,(BYTE *)plVar22);
          goto LAB_00130242;
        }
        lVar31 = plVar40[1];
        *plVar32 = *plVar40;
        plVar32[1] = lVar31;
        pBVar21 = seqStore->lit;
        if (0x10 < local_d0) {
          lVar31 = (long)(pBVar21 + 0x10) - (long)(plVar40 + 2);
          if (lVar31 < 8) {
            if (-0x10 < lVar31) goto LAB_00131a42;
          }
          else if (0xffffffffffffffe0 < lVar31 - 0x10U) goto LAB_00131a61;
          lVar31 = plVar40[3];
          *(long *)(pBVar21 + 0x10) = plVar40[2];
          *(long *)(pBVar21 + 0x18) = lVar31;
          if (0x20 < (long)local_d0) {
            lVar31 = 0;
            do {
              puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x20);
              uVar10 = puVar2[1];
              pBVar1 = pBVar21 + lVar31 + 0x20;
              *(undefined8 *)pBVar1 = *puVar2;
              *(undefined8 *)(pBVar1 + 8) = uVar10;
              puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x30);
              uVar10 = puVar2[1];
              *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
              *(undefined8 *)(pBVar1 + 0x18) = uVar10;
              lVar31 = lVar31 + 0x20;
            } while (pBVar1 + 0x20 < pBVar21 + lVar19);
          }
          goto LAB_00130242;
        }
LAB_00130318:
        seqStore->lit = pBVar21 + lVar19;
LAB_00130324:
        uVar23 = (local_100 - lVar41) + 1;
        lVar19 = (local_100 - lVar41) + 4;
        psVar37 = seqStore->sequences;
        psVar37->litLength = (short)lVar41 + ((short)plVar20 - (short)plVar40);
        psVar37->offset = uVar13 + 3;
        uVar14 = local_104;
        if (uVar23 < 0x10000) goto LAB_00130395;
        if (seqStore->longLengthID == 0) goto LAB_0013036e;
        goto LAB_0013194a;
      }
    }
    else {
      uVar13 = pUVar9[(ulong)(lVar41 * -0x30e4432340650000) >> (0x40U - cVar12 & 0x3f)];
      uVar23 = (ulong)uVar13;
      if ((uVar4 < uVar13) && (*(int *)(pBVar8 + uVar23) == (int)*plVar20)) {
        uVar13 = (UVar26 - uVar38) - uVar13;
        local_100 = ZSTD_count_2segments
                              ((BYTE *)((long)plVar20 + 4),pBVar8 + uVar23 + 4,(BYTE *)iEnd,
                               (BYTE *)mEnd,iStart);
        for (lVar41 = 0;
            ((plVar44 = (long *)((long)plVar20 + lVar41), pBVar27 < pBVar8 + lVar41 + uVar23 &&
             (plVar40 < plVar44)) &&
            (*(BYTE *)((long)plVar20 + lVar41 + -1) == pBVar8[lVar41 + (uVar23 - 1)]));
            lVar41 = lVar41 + -1) {
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001318ce;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001318ed;
        plVar32 = (long *)seqStore->lit;
        lVar36 = (long)plVar20 - (long)plVar40;
        lVar19 = lVar36 + lVar41;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + lVar19))
        goto LAB_0013190c;
        if (iEnd < plVar44) goto LAB_0013192b;
        local_d0 = (long)plVar44 - (long)plVar40;
        if (plVar22 < plVar44) goto LAB_0013021e;
        lVar31 = plVar40[1];
        *plVar32 = *plVar40;
        plVar32[1] = lVar31;
        pBVar21 = seqStore->lit;
        if (local_d0 < 0x11) goto LAB_00130318;
        lVar31 = (long)(pBVar21 + 0x10) - (long)(plVar40 + 2);
        if (lVar31 < 8) {
          if (-0x10 < lVar31) goto LAB_00131a42;
        }
        else if (0xffffffffffffffe0 < lVar31 - 0x10U) goto LAB_00131a61;
        lVar31 = plVar40[3];
        *(long *)(pBVar21 + 0x10) = plVar40[2];
        *(long *)(pBVar21 + 0x18) = lVar31;
        if (0x20 < (long)local_d0) {
          lVar31 = 0;
          do {
            puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x20);
            uVar10 = puVar2[1];
            pBVar1 = pBVar21 + lVar31 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar10;
            puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x30);
            uVar10 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar10;
            lVar31 = lVar31 + 0x20;
          } while (pBVar1 + 0x20 < pBVar21 + lVar19);
        }
LAB_00130242:
        seqStore->lit = seqStore->lit + lVar41 + lVar36;
        if (local_d0 < 0x10000) goto LAB_00130324;
        if (seqStore->longLengthID != 0) goto LAB_00131a23;
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        goto LAB_00130324;
      }
    }
    plVar20 = (long *)((long)plVar20 + ((long)plVar20 - (long)plVar40 >> 8) + uVar15);
    goto LAB_0012fe41;
  }
  if (uVar33 < uVar34) goto LAB_00131988;
  if (uVar3 < uVar30) goto LAB_001319a7;
  if (uVar29 < local_104) goto LAB_001319c6;
  if (uVar29 < uVar14) goto LAB_001319e5;
  bVar17 = 0x40 - cVar11;
  plVar22 = iEnd + -4;
  plVar20 = (long *)((long)src + (ulong)(iVar28 == iVar25));
LAB_00130730:
  if (plVar18 <= plVar20) goto LAB_00130fae;
  lVar41 = *plVar20;
  uVar23 = (ulong)(lVar41 * -0x30e4432345000000) >> (bVar17 & 0x3f);
  uVar24 = (long)plVar20 - (long)pBVar7;
  uVar13 = pUVar6[uVar23];
  UVar26 = (U32)uVar24;
  uVar29 = (UVar26 - local_104) + 1;
  pUVar6[uVar23] = UVar26;
  if (2 < (uVar3 - 1) - uVar29) {
    piVar35 = (int *)(pBVar7 + uVar29);
    if (uVar29 < uVar3) {
      piVar35 = (int *)(pBVar8 + (uVar29 - uVar38));
    }
    if (*piVar35 != *(int *)((long)plVar20 + 1)) goto LAB_00130797;
    plVar44 = iEnd;
    if (uVar29 < uVar3) {
      plVar44 = mEnd;
    }
    sVar16 = ZSTD_count_2segments
                       ((BYTE *)((long)plVar20 + 5),(BYTE *)(piVar35 + 1),(BYTE *)iEnd,
                        (BYTE *)plVar44,iStart);
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) goto LAB_001318ce;
    if (0x20000 < seqStore->maxNbLit) goto LAB_001318ed;
    plVar44 = (long *)((long)plVar20 + 1);
    uVar42 = (long)plVar44 - (long)plVar40;
    plVar20 = (long *)seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar20 + uVar42))
    goto LAB_0013190c;
    if (iEnd < plVar44) goto LAB_0013192b;
    if (plVar22 < plVar44) {
      ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar40,(BYTE *)plVar44,(BYTE *)plVar22);
LAB_001308f9:
      seqStore->lit = seqStore->lit + uVar42;
      if (0xffff < uVar42) {
        if (seqStore->longLengthID != 0) goto LAB_00131a23;
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      lVar41 = plVar40[1];
      *plVar20 = *plVar40;
      plVar20[1] = lVar41;
      pBVar21 = seqStore->lit;
      if (0x10 < uVar42) {
        lVar41 = (long)(pBVar21 + 0x10) - (long)(plVar40 + 2);
        if (lVar41 < 8) {
          if (-0x10 < lVar41) goto LAB_00131a42;
        }
        else if (0xffffffffffffffe0 < lVar41 - 0x10U) goto LAB_00131a61;
        lVar41 = plVar40[3];
        *(long *)(pBVar21 + 0x10) = plVar40[2];
        *(long *)(pBVar21 + 0x18) = lVar41;
        if (0x20 < (long)uVar42) {
          lVar41 = 0;
          do {
            puVar2 = (undefined8 *)((long)plVar40 + lVar41 + 0x20);
            uVar10 = puVar2[1];
            pBVar1 = pBVar21 + lVar41 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar10;
            puVar2 = (undefined8 *)((long)plVar40 + lVar41 + 0x30);
            uVar10 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar10;
            lVar41 = lVar41 + 0x20;
          } while (pBVar1 + 0x20 < pBVar21 + uVar42);
        }
        goto LAB_001308f9;
      }
      seqStore->lit = pBVar21 + uVar42;
    }
    lVar19 = sVar16 + 4;
    uVar23 = sVar16 + 1;
    psVar37 = seqStore->sequences;
    psVar37->litLength = (U16)uVar42;
    psVar37->offset = 1;
    uVar13 = local_104;
    if (0xffff < uVar23) {
      if (seqStore->longLengthID != 0) goto LAB_0013194a;
LAB_00130c62:
      local_104 = uVar13;
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar37 - (long)seqStore->sequencesStart) >> 3);
      uVar13 = local_104;
    }
LAB_00130c89:
    local_104 = uVar13;
    plVar40 = (long *)(lVar19 + (long)plVar44);
    psVar37->matchLength = (U16)uVar23;
    psVar37 = psVar37 + 1;
    seqStore->sequences = psVar37;
    plVar20 = plVar40;
    if (plVar40 <= plVar18) {
      if (pBVar7 + (uVar24 & 0xffffffff) + 2 <= src) goto LAB_00131a04;
      pUVar6[(ulong)(*(long *)(pBVar7 + (uVar24 & 0xffffffff) + 2) * -0x30e4432345000000) >>
             (bVar17 & 0x3f)] = UVar26 + 2;
      pUVar6[(ulong)(*(long *)((long)plVar40 + -2) * -0x30e4432345000000) >> (bVar17 & 0x3f)] =
           ((int)plVar40 + -2) - iVar43;
      uVar13 = uVar14;
      for (; uVar14 = uVar13, plVar20 = plVar40, plVar40 <= plVar18;
          plVar40 = (long *)((long)plVar40 + sVar16 + 4)) {
        UVar26 = (int)plVar40 - iVar43;
        uVar13 = UVar26 - uVar14;
        pBVar21 = pBVar7;
        if (uVar13 < uVar3) {
          pBVar21 = pBVar8 + -uVar39;
        }
        if (((uVar3 - 1) - uVar13 < 3) || (*(int *)(pBVar21 + uVar13) != (int)*plVar40)) break;
        plVar20 = iEnd;
        if (uVar13 < uVar3) {
          plVar20 = mEnd;
        }
        sVar16 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar40 + 4),(BYTE *)((long)(pBVar21 + uVar13) + 4),
                            (BYTE *)iEnd,(BYTE *)plVar20,iStart);
        if (seqStore->maxNbSeq <= (ulong)((long)psVar37 - (long)seqStore->sequencesStart >> 3))
        goto LAB_001318ce;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001318ed;
        plVar20 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < plVar20) goto LAB_0013190c;
        if (iEnd < plVar40) goto LAB_0013192b;
        if (plVar22 < plVar40) {
          ZSTD_safecopyLiterals((BYTE *)plVar20,(BYTE *)plVar40,(BYTE *)plVar40,(BYTE *)plVar22);
        }
        else {
          lVar41 = plVar40[1];
          *plVar20 = *plVar40;
          plVar20[1] = lVar41;
        }
        psVar37 = seqStore->sequences;
        psVar37->litLength = 0;
        psVar37->offset = 1;
        if (0xffff < sVar16 + 1) {
          if (seqStore->longLengthID != 0) goto LAB_0013194a;
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar37 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar37->matchLength = (U16)(sVar16 + 1);
        psVar37 = psVar37 + 1;
        seqStore->sequences = psVar37;
        pUVar6[(ulong)(*plVar40 * -0x30e4432345000000) >> (bVar17 & 0x3f)] = UVar26;
        uVar13 = local_104;
        local_104 = uVar14;
      }
    }
    goto LAB_00130730;
  }
LAB_00130797:
  if (uVar3 < uVar13) {
    piVar35 = (int *)(pBVar7 + uVar13);
    if (*piVar35 == (int)*plVar20) {
      uVar13 = (int)plVar20 - (int)piVar35;
      local_100 = ZSTD_count((BYTE *)((long)plVar20 + 4),(BYTE *)(piVar35 + 1),(BYTE *)iEnd);
      for (lVar41 = 0;
          ((plVar44 = (long *)((long)plVar20 + lVar41), iStart < (BYTE *)((long)piVar35 + lVar41) &&
           (plVar40 < plVar44)) &&
          (*(BYTE *)((long)plVar20 + lVar41 + -1) == *(BYTE *)((long)piVar35 + lVar41 + -1)));
          lVar41 = lVar41 + -1) {
      }
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_001318ce;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001318ed;
      plVar32 = (long *)seqStore->lit;
      lVar36 = (long)plVar20 - (long)plVar40;
      lVar19 = lVar36 + lVar41;
      if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + lVar19))
      goto LAB_0013190c;
      if (iEnd < plVar44) goto LAB_0013192b;
      local_d0 = (long)plVar44 - (long)plVar40;
      if (plVar22 < plVar44) {
LAB_00130b12:
        ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)plVar40,(BYTE *)plVar44,(BYTE *)plVar22);
        goto LAB_00130b36;
      }
      lVar31 = plVar40[1];
      *plVar32 = *plVar40;
      plVar32[1] = lVar31;
      pBVar21 = seqStore->lit;
      if (0x10 < local_d0) {
        lVar31 = (long)(pBVar21 + 0x10) - (long)(plVar40 + 2);
        if (lVar31 < 8) {
          if (-0x10 < lVar31) goto LAB_00131a42;
        }
        else if (0xffffffffffffffe0 < lVar31 - 0x10U) goto LAB_00131a61;
        lVar31 = plVar40[3];
        *(long *)(pBVar21 + 0x10) = plVar40[2];
        *(long *)(pBVar21 + 0x18) = lVar31;
        if (0x20 < (long)local_d0) {
          lVar31 = 0;
          do {
            puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x20);
            uVar10 = puVar2[1];
            pBVar1 = pBVar21 + lVar31 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar10;
            puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x30);
            uVar10 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar10;
            lVar31 = lVar31 + 0x20;
          } while (pBVar1 + 0x20 < pBVar21 + lVar19);
        }
        goto LAB_00130b36;
      }
LAB_00130c0c:
      seqStore->lit = pBVar21 + lVar19;
LAB_00130c18:
      uVar23 = (local_100 - lVar41) + 1;
      lVar19 = (local_100 - lVar41) + 4;
      psVar37 = seqStore->sequences;
      psVar37->litLength = (short)lVar41 + ((short)plVar20 - (short)plVar40);
      psVar37->offset = uVar13 + 3;
      uVar14 = local_104;
      if (uVar23 < 0x10000) goto LAB_00130c89;
      if (seqStore->longLengthID == 0) goto LAB_00130c62;
      goto LAB_0013194a;
    }
  }
  else {
    uVar13 = pUVar9[(ulong)(lVar41 * -0x30e4432345000000) >> (0x40U - cVar12 & 0x3f)];
    uVar23 = (ulong)uVar13;
    if ((uVar4 < uVar13) && (*(int *)(pBVar8 + uVar23) == (int)*plVar20)) {
      uVar13 = (UVar26 - uVar38) - uVar13;
      local_100 = ZSTD_count_2segments
                            ((BYTE *)((long)plVar20 + 4),pBVar8 + uVar23 + 4,(BYTE *)iEnd,
                             (BYTE *)mEnd,iStart);
      for (lVar41 = 0;
          ((plVar44 = (long *)((long)plVar20 + lVar41), pBVar27 < pBVar8 + lVar41 + uVar23 &&
           (plVar40 < plVar44)) &&
          (*(BYTE *)((long)plVar20 + lVar41 + -1) == pBVar8[lVar41 + (uVar23 - 1)]));
          lVar41 = lVar41 + -1) {
      }
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_001318ce;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001318ed;
      plVar32 = (long *)seqStore->lit;
      lVar36 = (long)plVar20 - (long)plVar40;
      lVar19 = lVar36 + lVar41;
      if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + lVar19))
      goto LAB_0013190c;
      if (iEnd < plVar44) goto LAB_0013192b;
      local_d0 = (long)plVar44 - (long)plVar40;
      if (plVar22 < plVar44) goto LAB_00130b12;
      lVar31 = plVar40[1];
      *plVar32 = *plVar40;
      plVar32[1] = lVar31;
      pBVar21 = seqStore->lit;
      if (local_d0 < 0x11) goto LAB_00130c0c;
      lVar31 = (long)(pBVar21 + 0x10) - (long)(plVar40 + 2);
      if (lVar31 < 8) {
        if (-0x10 < lVar31) goto LAB_00131a42;
      }
      else if (0xffffffffffffffe0 < lVar31 - 0x10U) goto LAB_00131a61;
      lVar31 = plVar40[3];
      *(long *)(pBVar21 + 0x10) = plVar40[2];
      *(long *)(pBVar21 + 0x18) = lVar31;
      if (0x20 < (long)local_d0) {
        lVar31 = 0;
        do {
          puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x20);
          uVar10 = puVar2[1];
          pBVar1 = pBVar21 + lVar31 + 0x20;
          *(undefined8 *)pBVar1 = *puVar2;
          *(undefined8 *)(pBVar1 + 8) = uVar10;
          puVar2 = (undefined8 *)((long)plVar40 + lVar31 + 0x30);
          uVar10 = puVar2[1];
          *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
          *(undefined8 *)(pBVar1 + 0x18) = uVar10;
          lVar31 = lVar31 + 0x20;
        } while (pBVar1 + 0x20 < pBVar21 + lVar19);
      }
LAB_00130b36:
      seqStore->lit = seqStore->lit + lVar41 + lVar36;
      if (local_d0 < 0x10000) goto LAB_00130c18;
      if (seqStore->longLengthID != 0) goto LAB_00131a23;
      seqStore->longLengthID = 1;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      goto LAB_00130c18;
    }
  }
  plVar20 = (long *)((long)plVar20 + ((long)plVar20 - (long)plVar40 >> 8) + uVar15);
  goto LAB_00130730;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}